

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::util_convertBaseStatToWorking(HModel *this,int *cstat,int *rstat)

{
  double dVar1;
  value_type vVar2;
  int iVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int var_1;
  int row;
  int var;
  int col;
  int numBasic;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar8;
  uint local_30;
  uint local_28;
  int local_24;
  
  local_24 = 0;
  for (local_28 = 0; (int)local_28 < *(int *)(in_RDI + 0x60c); local_28 = local_28 + 1) {
    if (*(int *)(in_RSI + (long)(int)local_28 * 4) == 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)local_28)
      ;
      *pvVar4 = 0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)(int)local_28)
      ;
      *pvVar4 = 0;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),
                                  (long)local_24);
      *puVar5 = local_28;
      local_24 = local_24 + 1;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)local_28)
      ;
      *pvVar4 = 1;
      if (*(int *)(in_RSI + (long)(int)local_28 * 4) == 0) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                            (long)(int)local_28);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                            (long)(int)local_28);
        if ((dVar1 != *pvVar6) || (NAN(dVar1) || NAN(*pvVar6))) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                              (long)(int)local_28);
          *pvVar4 = 1;
        }
        else {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                              (long)(int)local_28);
          *pvVar4 = 0;
        }
      }
      else if (*(int *)(in_RSI + (long)(int)local_28 * 4) == 2) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                            (long)(int)local_28);
        *pvVar4 = -1;
      }
      else {
        if (*(int *)(in_RSI + (long)(int)local_28 * 4) != 3) {
          uVar8 = *(uint *)(in_RSI + (long)(int)local_28 * 4);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                              (long)(int)local_28);
          vVar2 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                              (long)(int)local_28);
          printf("Invalid basis status: col=%d, cstat=%d, lower=%g, upper=%g\n",vVar2,*pvVar6,
                 (ulong)local_28,(ulong)uVar8);
          return local_28 + 1;
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),
                            (long)(int)local_28);
        *pvVar4 = 0;
      }
    }
  }
  local_30 = 0;
  do {
    if (*(int *)(in_RDI + 0x610) <= (int)local_30) {
      populate_WorkArrays((HModel *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      mlFg_Update((HModel *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff7c);
      return 0;
    }
    iVar3 = *(int *)(in_RDI + 0x60c) + local_30;
    if (*(int *)(in_RDX + (long)(int)local_30 * 4) == 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)iVar3);
      *pvVar4 = 0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
      *pvVar4 = 0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_24);
      *pvVar4 = iVar3;
      local_24 = local_24 + 1;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)iVar3);
      *pvVar4 = 1;
      if (*(int *)(in_RDX + (long)(int)local_30 * 4) == 0) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                            (long)(int)local_30);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                            (long)(int)local_30);
        if ((dVar1 != *pvVar6) || (NAN(dVar1) || NAN(*pvVar6))) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
          *pvVar4 = -1;
        }
        else {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
          *pvVar4 = 0;
        }
      }
      else if (*(int *)(in_RDX + (long)(int)local_30 * 4) == 2) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
        *pvVar4 = 1;
      }
      else {
        if (*(int *)(in_RDX + (long)(int)local_30 * 4) != 3) {
          uVar8 = *(uint *)(in_RDX + (long)(int)local_30 * 4);
          uVar7 = local_30;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                              (long)(int)local_30);
          vVar2 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                              (long)(int)local_30);
          printf("Invalid basis status: row=%d, rstat=%d, lower=%g, upper=%g\n",vVar2,*pvVar6,
                 (ulong)uVar7,(ulong)uVar8);
          return -(local_30 + 1);
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)iVar3);
        *pvVar4 = 0;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int HModel::util_convertBaseStatToWorking(const int* cstat, const int* rstat) {
  int numBasic=0;
  for (int col = 0; col < numCol; col++) {
    int var = col;
    if (cstat[col] == HSOL_BASESTAT_BASIC) {
      nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      basicIndex[numBasic] = var;
      numBasic++;
      continue;
    }
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    if (cstat[col] == HSOL_BASESTAT_LOWER) {
      //HSOL_BASESTAT_LOWER includes fixed variables
      if (colLower[col] == colUpper[col]) {
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
	continue;
      }
      else {
	nonbasicMove[var] = NONBASIC_MOVE_UP;
	continue;
      }
    }
    else if (cstat[col] == HSOL_BASESTAT_UPPER) {
      nonbasicMove[var] = NONBASIC_MOVE_DN;
      continue;
    }
    else if (cstat[col] == HSOL_BASESTAT_ZERO) {
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      continue;
    }
    else {
#ifdef JAJH_dev
      printf("Invalid basis status: col=%d, cstat=%d, lower=%g, upper=%g\n",
	     col, cstat[col], colLower[col], colUpper[col]);
#endif
      return col+1;
    }
  }
  for (int row = 0; row < numRow; row++) {
    int var = numCol + row;
    if (rstat[row] == HSOL_BASESTAT_BASIC) {
      nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      basicIndex[numBasic] = var;
      numBasic++;
      continue;
    }
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    if (rstat[row] == HSOL_BASESTAT_LOWER) {
      //HSOL_BASESTAT_LOWER includes fixed variables
      if (rowLower[row] == rowUpper[row]) {
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
	continue;
      }
      else {
	nonbasicMove[var] = NONBASIC_MOVE_DN;
	continue;
      }
    }
    else if (rstat[row] == HSOL_BASESTAT_UPPER) {
      nonbasicMove[var] = NONBASIC_MOVE_UP;
      continue;}
    else if (rstat[row] == HSOL_BASESTAT_ZERO) {
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      continue;}
    else {
#ifdef JAJH_dev
      printf("Invalid basis status: row=%d, rstat=%d, lower=%g, upper=%g\n",
	     row, rstat[row], rowLower[row], rowUpper[row]);
#endif
      return -(row+1);}
      printf("convertBaseStatToWorking: row=%d, rstat=%d, lower=%g, upper=%g, nonbasicMove=%d\n",
	     row, rstat[row], rowLower[row], rowUpper[row], nonbasicMove[var]);
  }
  assert(numBasic=numRow);
  populate_WorkArrays();
  mlFg_Update(mlFg_action_NewBasis);
  return 0;
}